

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O2

void jpeg_suppress_tables(j_compress_ptr cinfo,boolean suppress)

{
  long lVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    if (cinfo->quant_tbl_ptrs[lVar2] != (JQUANT_TBL *)0x0) {
      cinfo->quant_tbl_ptrs[lVar2]->sent_table = suppress;
    }
  }
  for (lVar2 = -0x20; lVar2 != 0; lVar2 = lVar2 + 8) {
    lVar1 = *(long *)((long)cinfo->ac_huff_tbl_ptrs + lVar2);
    if (lVar1 != 0) {
      *(boolean *)(lVar1 + 0x114) = suppress;
    }
    if (*(long *)(cinfo->arith_dc_L + lVar2) != 0) {
      *(boolean *)(*(long *)(cinfo->arith_dc_L + lVar2) + 0x114) = suppress;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_suppress_tables (j_compress_ptr cinfo, boolean suppress)
{
  int i;
  JQUANT_TBL * qtbl;
  JHUFF_TBL * htbl;

  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    if ((qtbl = cinfo->quant_tbl_ptrs[i]) != NULL)
      qtbl->sent_table = suppress;
  }

  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    if ((htbl = cinfo->dc_huff_tbl_ptrs[i]) != NULL)
      htbl->sent_table = suppress;
    if ((htbl = cinfo->ac_huff_tbl_ptrs[i]) != NULL)
      htbl->sent_table = suppress;
  }
}